

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O2

void __thiscall
jrtplib::RTCPCompoundPacket::RTCPCompoundPacket
          (RTCPCompoundPacket *this,uint8_t *packet,size_t packetlen,bool deletedata,
          RTPMemoryManager *mgr)

{
  int iVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_0014dc60;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->rtcppacklist;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->rtcppacklist;
  this->compoundpacket = (uint8_t *)0x0;
  this->compoundpacketlength = 0;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->rtcppackit)._M_node = (_List_node_base *)0x0;
  iVar1 = ParseData(this,packet,packetlen);
  this->error = iVar1;
  if (-1 < iVar1) {
    this->compoundpacket = packet;
    this->compoundpacketlength = packetlen;
    this->deletepacket = deletedata;
    (this->rtcppackit)._M_node =
         (this->rtcppacklist).
         super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
         _M_node.super__List_node_base._M_next;
  }
  return;
}

Assistant:

RTCPCompoundPacket::RTCPCompoundPacket(uint8_t *packet, size_t packetlen, bool deletedata, RTPMemoryManager *mgr) : RTPMemoryObject(mgr)
{
	compoundpacket = 0;
	compoundpacketlength = 0;
	
	error = ParseData(packet,packetlen);
	if (error < 0)
		return;
	
	compoundpacket = packet;
	compoundpacketlength = packetlen;
	deletepacket = deletedata;

	rtcppackit = rtcppacklist.begin();
}